

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::_getAddressTakenFuns(LazyLLVMCallGraph *this,CallInst *C)

{
  bool bVar1;
  reference ppFVar2;
  Function *in_RDX;
  value_type *in_RSI;
  FuncVec *in_RDI;
  Function *fun;
  iterator __end2;
  iterator __begin2;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range2;
  FuncVec *ret;
  FuncVec *__lhs;
  Function *this_00;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  in_stack_ffffffffffffffd0;
  value_type *ppFVar3;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar4;
  
  __lhs = in_RDI;
  if (((ulong)in_RSI[0x14] & 1) == 0) {
    _initializeAddressTaken((LazyLLVMCallGraph *)in_stack_ffffffffffffffd0._M_current);
  }
  uVar4 = 0;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x188a1a);
  ppFVar3 = in_RSI + 0x11;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin(in_RDI);
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                             *)__lhs,(__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                                      *)in_RDI), bVar1) {
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
              ::operator*((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                           *)&stack0xffffffffffffffd0);
    this_00 = *ppFVar2;
    bVar1 = anon_unknown_2::callIsCompatible
                      (in_RDX,(CallInst *)CONCAT17(uVar4,in_stack_ffffffffffffffe0),
                       (CallCompatibility)((ulong)ppFVar3 >> 0x20));
    if (bVar1) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)this_00,
                 in_RSI);
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator++((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                  *)&stack0xffffffffffffffd0);
  }
  return __lhs;
}

Assistant:

FuncVec _getAddressTakenFuns(const llvm::CallInst *C) {
        // FIXME: check that C calls initialized values
        // (in many non-executable pieces of code, the call may call
        // an uninitialized function pointer. Return no function
        // in such cases instead of all address taken functions.
        if (!_address_taken_initialized)
            _initializeAddressTaken();
        assert(_address_taken_initialized);

        FuncVec ret;
        // filter out compatible functions
        for (auto *fun : _address_taken) {
            if (callIsCompatible(fun, C)) {
                ret.push_back(fun);
            }
        }
        return ret;
    }